

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O0

void g_ptr_array_maybe_expand(GRealPtrArray *array,guint len)

{
  guint gVar1;
  gpointer *ppvVar2;
  guint local_1c;
  guint old_alloc;
  guint len_local;
  GRealPtrArray *array_local;
  
  if (array->alloc < array->len + len) {
    gVar1 = g_nearest_pow(array->len + len);
    array->alloc = gVar1;
    if (array->alloc < 0x11) {
      local_1c = 0x10;
    }
    else {
      local_1c = array->alloc;
    }
    array->alloc = local_1c;
    ppvVar2 = (gpointer *)g_realloc(array->pdata,(ulong)array->alloc << 3);
    array->pdata = ppvVar2;
  }
  return;
}

Assistant:

static void g_ptr_array_maybe_expand (GRealPtrArray *array, guint len)
{
    /* Detect potential overflow */
    //if ((G_MAXUINT - array->len) < len)
    //  g_error ("adding %u to array would overflow", len);

    if ((array->len + len) > array->alloc)
    {
        guint old_alloc = array->alloc;
        array->alloc = g_nearest_pow (array->len + len);
        array->alloc = MAX (array->alloc, MIN_ARRAY_SIZE);
        array->pdata = g_realloc (array->pdata, sizeof (gpointer) * array->alloc);
        if (g_mem_gc_friendly)
            for ( ; old_alloc < array->alloc; old_alloc++)
                array->pdata [old_alloc] = NULL;
    }
}